

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Polynomial.hpp
# Opt level: O2

void __thiscall
OpenMD::Polynomial<double>::addCoefficient
          (Polynomial<double> *this,int exponent,double *coefficient)

{
  iterator iVar1;
  int local_14;
  
  local_14 = exponent;
  iVar1 = std::
          _Rb_tree<int,_std::pair<const_int,_double>,_std::_Select1st<std::pair<const_int,_double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
          ::find((_Rb_tree<int,_std::pair<const_int,_double>,_std::_Select1st<std::pair<const_int,_double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
                  *)this,&local_14);
  if ((_Rb_tree_header *)iVar1._M_node == &(this->polyPairMap_)._M_t._M_impl.super__Rb_tree_header)
  {
    setCoefficient(this,local_14,coefficient);
  }
  else {
    iVar1._M_node[1]._M_parent = (_Base_ptr)(*coefficient + (double)iVar1._M_node[1]._M_parent);
  }
  return;
}

Assistant:

void addCoefficient(int exponent, const Real& coefficient) {
      iterator i = polyPairMap_.find(exponent);

      if (i != end()) {
        i->second += coefficient;
      } else {
        setCoefficient(exponent, coefficient);
      }
    }